

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# collationsettings.cpp
# Opt level: O0

void __thiscall
icu_63::CollationSettings::setFlag
          (CollationSettings *this,int32_t bit,UColAttributeValue value,int32_t defaultOptions,
          UErrorCode *errorCode)

{
  UBool UVar1;
  UErrorCode *errorCode_local;
  int32_t defaultOptions_local;
  UColAttributeValue value_local;
  int32_t bit_local;
  CollationSettings *this_local;
  
  UVar1 = ::U_FAILURE(*errorCode);
  if (UVar1 == '\0') {
    if (value == UCOL_DEFAULT) {
      this->options = this->options & (bit ^ 0xffffffffU) | defaultOptions & bit;
    }
    else if (value == UCOL_OFF) {
      this->options = (bit ^ 0xffffffffU) & this->options;
    }
    else if (value == UCOL_ON) {
      this->options = bit | this->options;
    }
    else {
      *errorCode = U_ILLEGAL_ARGUMENT_ERROR;
    }
  }
  return;
}

Assistant:

void
CollationSettings::setFlag(int32_t bit, UColAttributeValue value,
                           int32_t defaultOptions, UErrorCode &errorCode) {
    if(U_FAILURE(errorCode)) { return; }
    switch(value) {
    case UCOL_ON:
        options |= bit;
        break;
    case UCOL_OFF:
        options &= ~bit;
        break;
    case UCOL_DEFAULT:
        options = (options & ~bit) | (defaultOptions & bit);
        break;
    default:
        errorCode = U_ILLEGAL_ARGUMENT_ERROR;
        break;
    }
}